

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O0

void nni_thr_fini(nni_thr *thr)

{
  nni_thr *thr_local;
  
  if (thr->init != 0) {
    nni_plat_mtx_lock(&thr->mtx);
    thr->stop = 1;
    nni_plat_cv_wake(&thr->cv);
    while (thr->done == 0) {
      nni_plat_cv_wait(&thr->cv);
    }
    nni_plat_mtx_unlock(&thr->mtx);
    if (thr->fn != (nni_thr_func)0x0) {
      nni_plat_thr_fini(&thr->thr);
    }
    nni_plat_cv_fini(&thr->cv);
    nni_plat_mtx_fini(&thr->mtx);
    thr->init = 0;
  }
  return;
}

Assistant:

void
nni_thr_fini(nni_thr *thr)
{
	if (!thr->init) {
		return;
	}
	nni_plat_mtx_lock(&thr->mtx);
	thr->stop = 1;
	nni_plat_cv_wake(&thr->cv);
	while (!thr->done) {
		nni_plat_cv_wait(&thr->cv);
	}
	nni_plat_mtx_unlock(&thr->mtx);
	if (thr->fn != NULL) {
		nni_plat_thr_fini(&thr->thr);
	}

	nni_plat_cv_fini(&thr->cv);
	nni_plat_mtx_fini(&thr->mtx);
	thr->init = 0;
}